

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl.h
# Opt level: O0

void __thiscall
flatbuffers::SymbolTable<flatbuffers::StructDef>::Move
          (SymbolTable<flatbuffers::StructDef> *this,string *oldname,string *newname)

{
  StructDef *pSVar1;
  bool bVar2;
  pointer ppVar3;
  mapped_type *ppSVar4;
  StructDef *obj;
  _Self local_28;
  iterator it;
  string *newname_local;
  string *oldname_local;
  SymbolTable<flatbuffers::StructDef> *this_local;
  
  it._M_node = (_Base_ptr)newname;
  local_28._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::StructDef_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::StructDef_*>_>_>
       ::find(&this->dict,oldname);
  obj = (StructDef *)
        std::
        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::StructDef_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::StructDef_*>_>_>
        ::end(&this->dict);
  bVar2 = std::operator!=(&local_28,(_Self *)&obj);
  if (!bVar2) {
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/include/flatbuffers/idl.h"
                  ,0x102,
                  "void flatbuffers::SymbolTable<flatbuffers::StructDef>::Move(const std::string &, const std::string &) [T = flatbuffers::StructDef]"
                 );
  }
  ppVar3 = std::
           _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::StructDef_*>_>
           ::operator->(&local_28);
  pSVar1 = ppVar3->second;
  std::
  map<std::__cxx11::string,flatbuffers::StructDef*,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,flatbuffers::StructDef*>>>
  ::erase_abi_cxx11_((map<std::__cxx11::string,flatbuffers::StructDef*,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,flatbuffers::StructDef*>>>
                      *)this,(iterator)local_28._M_node);
  ppSVar4 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::StructDef_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::StructDef_*>_>_>
            ::operator[](&this->dict,(key_type *)it._M_node);
  *ppSVar4 = pSVar1;
  return;
}

Assistant:

void Move(const std::string &oldname, const std::string &newname) {
    auto it = dict.find(oldname);
    if (it != dict.end()) {
      auto obj = it->second;
      dict.erase(it);
      dict[newname] = obj;
    } else {
      FLATBUFFERS_ASSERT(false);
    }
  }